

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iSWAP.hpp
# Opt level: O0

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::iSWAP<std::complex<float>_>::matrix(iSWAP<std::complex<float>_> *this)

{
  complex<float> m31;
  complex<float> m01;
  data_type extraout_RDX;
  complex<float> in_RSI;
  complex<float> in_R8;
  complex<float> in_R9;
  SquareMatrix<std::complex<float>_> SVar1;
  float __r;
  float __i;
  complex<float> m33;
  complex<float> local_a0;
  complex<float> local_98;
  complex<float> local_90;
  complex<float> local_88;
  complex<float> local_80;
  complex<float> local_78;
  complex<float> local_70;
  complex<float> local_68;
  complex<float> local_60;
  _ComplexT local_58;
  complex<float> local_50;
  complex<float> local_48;
  complex<float> local_40;
  complex<float> local_38;
  complex<float> local_30;
  complex<float> local_28;
  complex<float> local_20;
  complex<float> i;
  iSWAP<std::complex<float>_> *this_local;
  
  __i = 0.0;
  __r = 1.0;
  m33._M_value = (_ComplexT)this;
  std::complex<float>::complex(&local_20,0.0,1.0);
  std::complex<float>::complex(&local_28,__r,__i);
  std::complex<float>::complex(&local_30,__i,__i);
  std::complex<float>::complex(&local_38,__i,__i);
  std::complex<float>::complex(&local_40,__i,__i);
  std::complex<float>::complex(&local_48,__i,__i);
  std::complex<float>::complex(&local_50,__i,__i);
  local_58 = local_20._M_value;
  std::complex<float>::complex(&local_60,__i,__i);
  std::complex<float>::complex(&local_68,__i,__i);
  local_70._M_value = local_20._M_value;
  std::complex<float>::complex(&local_78,__i,__i);
  std::complex<float>::complex(&local_80,__i,__i);
  std::complex<float>::complex(&local_88,__i,__i);
  std::complex<float>::complex(&local_90,__i,__i);
  std::complex<float>::complex(&local_98,__i,__i);
  std::complex<float>::complex(&local_a0,__r,__i);
  m31._M_value._4_4_ = __i;
  m31._M_value._0_4_ = __r;
  dense::SquareMatrix<std::complex<float>_>::SquareMatrix
            ((SquareMatrix<std::complex<float>_> *)this,in_RSI,m01,local_68,in_R8,in_R9,local_68,
             local_70,local_78,local_80,local_88,local_90,local_98,local_a0,m31,(complex<float>)this
             ,m33);
  SVar1.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar1.size_ = m33._M_value;
  return SVar1;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T i(0,1) ;
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , i , 0 ,
                                                  0 , i , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }